

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O1

int IDASetRootDirection(void *ida_mem,int *rootdir)

{
  uint uVar1;
  long lVar2;
  int line;
  ulong uVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    error_code = -0x14;
    line = 0x291;
  }
  else {
    uVar1 = *(uint *)((long)ida_mem + 0x780);
    if ((ulong)uVar1 != 0) {
      if (0 < (int)uVar1) {
        lVar2 = *(long *)((long)ida_mem + 0x790);
        uVar3 = 0;
        do {
          *(int *)(lVar2 + uVar3 * 4) = rootdir[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        return 0;
      }
      return 0;
    }
    msgfmt = "Rootfinding was not initialized.";
    iVar4 = -0x16;
    error_code = -0x16;
    line = 0x29a;
  }
  IDAProcessError((IDAMem)0x0,error_code,line,"IDASetRootDirection",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDASetRootDirection(void* ida_mem, int* rootdir)
{
  IDAMem IDA_mem;
  int i, nrt;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  nrt = IDA_mem->ida_nrtfn;
  if (nrt == 0)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_ROOT);
    return (IDA_ILL_INPUT);
  }

  for (i = 0; i < nrt; i++) { IDA_mem->ida_rootdir[i] = rootdir[i]; }

  return (IDA_SUCCESS);
}